

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

float closest_point_ray_circle(vec3 ro,vec3 rd,vec3 cc,vec3 cn,float cr,float *s,vec3 *c1,vec3 *c2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  float fVar4;
  undefined8 in_XMM0_Qb;
  float fVar5;
  float fVar6;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float t;
  int idx;
  float local_8c;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  int local_4c;
  undefined1 local_48 [16];
  vec3 local_38;
  vec3 local_28;
  
  local_38.z = cn.z;
  fVar12 = cc.z;
  local_78 = ro.z;
  local_28._0_8_ = cc._0_8_;
  local_48._8_4_ = in_XMM4_Dc;
  local_48._0_4_ = local_28.x;
  local_48._4_4_ = local_28.y;
  local_48._12_4_ = in_XMM4_Dd;
  local_38._0_8_ = cn._0_8_;
  fStack_60 = (float)(int)in_XMM0_Qb;
  local_68 = (undefined1  [8])ro._0_8_;
  fStack_5c = (float)(int)((ulong)in_XMM0_Qb >> 0x20);
  local_88._8_4_ = in_XMM2_Dc;
  local_88._0_8_ = rd._0_8_;
  local_88._12_4_ = in_XMM2_Dd;
  local_28.z = fVar12;
  _Var3 = ray_intersect_planes(ro,rd,&local_28,&local_38,1,&local_8c,&local_4c);
  if (_Var3) {
    *s = local_8c;
    fVar10 = (float)local_88._0_4_ * local_8c + (float)local_68._0_4_;
    fVar7 = (float)local_68._4_4_ + (float)local_88._4_4_ * local_8c;
    fVar5 = rd.z * local_8c + local_78;
    c1->x = fVar10;
    c1->y = fVar7;
    c1->z = fVar5;
    fVar10 = fVar10 - (float)local_48._0_4_;
    fVar7 = fVar7 - (float)local_48._4_4_;
    fVar5 = fVar5 - fVar12;
    fVar4 = fVar5 * fVar5 + fVar10 * fVar10 + fVar7 * fVar7;
    if (fVar4 < 0.0) {
      local_68._0_4_ = fVar7;
      fStack_60 = (float)local_68._4_4_;
      fStack_5c = (float)local_68._4_4_;
      local_78 = (float)local_48._4_4_;
      fStack_74 = (float)local_48._4_4_;
      fStack_70 = (float)local_48._4_4_;
      fStack_6c = (float)local_48._4_4_;
      local_88._0_4_ = fVar10;
      fVar4 = sqrtf(fVar4);
      fVar7 = (float)local_68._0_4_;
      fVar9 = local_78;
      fVar10 = (float)local_88._0_4_;
    }
    else {
      fVar4 = SQRT(fVar4);
      fVar9 = (float)local_48._4_4_;
    }
    fVar6 = 0.0;
    fVar11 = 0.0;
    fVar8 = 0.0;
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      fVar11 = fVar10 / fVar4;
      fVar8 = fVar7 / fVar4;
      fVar6 = fVar5 / fVar4;
    }
    fVar7 = fVar11 * cr + (float)local_48._0_4_;
    fVar9 = fVar9 + fVar8 * cr;
    fVar12 = fVar6 * cr + fVar12;
    c2->x = fVar7;
    c2->y = fVar9;
    c2->z = fVar12;
    uVar1 = c1->x;
    uVar2 = c1->y;
    fVar7 = (float)uVar1 - fVar7;
    fVar9 = (float)uVar2 - fVar9;
    fVar12 = c1->z - fVar12;
    fVar12 = fVar12 * fVar12 + fVar7 * fVar7 + fVar9 * fVar9;
    if (fVar12 < 0.0) {
      fVar12 = sqrtf(fVar12);
      return fVar12;
    }
    fVar12 = SQRT(fVar12);
  }
  else {
    *s = 3.4028235e+38;
    c1->x = 3.4028235e+38;
    c1->y = 3.4028235e+38;
    c1->z = 3.4028235e+38;
    c2->x = 3.4028235e+38;
    c2->y = 3.4028235e+38;
    c2->z = 3.4028235e+38;
    fVar12 = 3.4028235e+38;
  }
  return fVar12;
}

Assistant:

float closest_point_ray_circle(vec3 ro, vec3 rd, vec3 cc, vec3 cn, float cr, float *s, vec3 *c1, vec3 *c2) {
    float t;
    int idx;
    if (ray_intersect_planes(ro, rd, &cc, &cn, 1, &t, &idx)) {
        *s = t;
        *c1 = vec3_add(ro, vec3_scale(rd, t));    
        *c2 = vec3_add(cc, vec3_set_length(vec3_subtract(*c1, cc), cr));
        return vec3_distance(*c1, *c2);
    } else {
        // This is wrong, but probably doesn't matter...
        *s = FLT_MAX;
        *c1 = V3(FLT_MAX, FLT_MAX, FLT_MAX);
        *c2 = V3(FLT_MAX, FLT_MAX, FLT_MAX);
        return FLT_MAX;
    }
}